

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_expression_classes.hpp
# Opt level: O2

void __thiscall
remora::
vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>>
::assign_to<remora::vector<double,remora::cpu_tag>>
          (vector_addition<remora::matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>>
           *this,vector_expression<remora::vector<double,_remora::cpu_tag>,_remora::cpu_tag> *x)

{
  matrix_vector_prod<remora::matrix_concat<remora::matrix<double,remora::row_major,remora::cpu_tag>,remora::scalar_matrix<int,remora::cpu_tag,remora::row_major>,true>,remora::vector<double,remora::cpu_tag>>
  ::assign_to<remora::vector<double,remora::cpu_tag>,remora::dense_tag>();
  bindings::
  vector_assign_functor<remora::vector<double,remora::cpu_tag>,remora::vector_scalar_multiply<remora::vector<double,remora::cpu_tag>>,remora::device_traits<remora::cpu_tag>::add<double>>
            (x,this + 0x58);
  return;
}

Assistant:

void assign_to(vector_expression<VecX, device_type>& x)const{
		//working around a bug in non-dense assign
		if(!std::is_base_of<dense_tag, typename E1::evaluation_category::tag>::value){
			x().clear();
			plus_assign(x, m_lhs);
		}else{
			assign(x, m_lhs);
		}
		plus_assign(x,m_rhs);
	}